

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O0

int CfdSetPsbtRedeemScript
              (void *handle,void *psbt_handle,int type,uint32_t index,char *redeem_script)

{
  bool bVar1;
  undefined8 uVar2;
  string *message;
  uint32_t in_ECX;
  int in_EDX;
  long in_RSI;
  char *in_R8;
  CfdException *except;
  exception *std_except;
  TxOut txout;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  Script script;
  CfdCapiPsbtHandle *psbt_obj;
  int result;
  Script *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd40;
  undefined8 in_stack_fffffffffffffd48;
  CfdError error_code;
  allocator *paVar3;
  CfdException *in_stack_fffffffffffffd50;
  Psbt *this;
  allocator local_241;
  string local_240 [32];
  CfdSourceLocation local_220;
  CfdSourceLocation local_208 [2];
  string *in_stack_fffffffffffffe38;
  void *in_stack_fffffffffffffe40;
  TxOut local_1b8;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_168;
  allocator local_149;
  string local_148;
  Script local_128;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  CfdSourceLocation local_c8;
  undefined1 local_aa;
  allocator local_a9;
  string local_a8 [32];
  CfdSourceLocation local_88;
  long local_70;
  allocator local_61;
  string local_60 [52];
  undefined4 local_2c;
  char *local_28;
  uint32_t local_20;
  int local_1c;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  local_2c = 0xffffffff;
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"PsbtHandle",&local_61);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_70 = local_18;
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    local_88.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_88.filename = local_88.filename + 1;
    local_88.line = 0x887;
    local_88.funcname = "CfdSetPsbtRedeemScript";
    cfd::core::logger::warn<>(&local_88,"redeem_script is null or empty.");
    local_aa = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_a8,"Failed to parameter. redeem_script is null or empty.",&local_a9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd50,error_code,in_stack_fffffffffffffd40);
    local_aa = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)(local_70 + 0x18) == 0) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_psbt.cpp"
                 ,0x2f);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0x88d;
    local_c8.funcname = "CfdSetPsbtRedeemScript";
    cfd::core::logger::warn<>(&local_c8,"psbt is null.");
    local_ea = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"Failed to handle statement. psbt is null.",&local_e9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd50,error_code,in_stack_fffffffffffffd40);
    local_ea = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,local_28,&local_149);
  cfd::core::Script::Script(&local_128,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector(&local_168);
  if (local_1c == 2) {
    cfd::core::Psbt::GetTxInUtxo(&local_1b8,*(Psbt **)(local_70 + 0x18),local_20,false,(bool *)0x0);
    this = *(Psbt **)(local_70 + 0x18);
    cfd::core::TxOutReference::TxOutReference((TxOutReference *)local_208,&local_1b8);
    cfd::core::Psbt::SetTxInUtxo(this,local_20,(TxOutReference *)local_208,&local_128,&local_168);
    cfd::core::TxOutReference::~TxOutReference((TxOutReference *)0x6329c8);
    cfd::core::TxOut::~TxOut((TxOut *)0x6329d5);
  }
  else {
    if (local_1c != 3) {
      local_220.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_psbt.cpp"
                   ,0x2f);
      local_220.filename = local_220.filename + 1;
      local_220.line = 0x89f;
      local_220.funcname = "CfdSetPsbtRedeemScript";
      cfd::core::logger::warn<int&>(&local_220,"type is invalid: {}",&local_1c);
      message = (string *)__cxa_allocate_exception(0x30);
      paVar3 = &local_241;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_240,"Failed to parameter. type is invalid.",paVar3);
      cfd::core::CfdException::CfdException
                (in_stack_fffffffffffffd50,(CfdError)((ulong)paVar3 >> 0x20),message);
      __cxa_throw(message,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
      ;
    }
    cfd::core::Psbt::SetTxOutData(*(Psbt **)(local_70 + 0x18),local_20,&local_128,&local_168);
  }
  local_4 = 0;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             in_stack_fffffffffffffd40);
  cfd::core::Script::~Script(in_stack_fffffffffffffd30);
  return local_4;
}

Assistant:

int CfdSetPsbtRedeemScript(
    void* handle, void* psbt_handle, int type, uint32_t index,
    const char* redeem_script) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(redeem_script)) {
      warn(CFD_LOG_SOURCE, "redeem_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. redeem_script is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    Script script(redeem_script);
    std::vector<KeyData> key_list;
    switch (type) {
      case kCfdPsbtRecordTypeInput: {
        auto txout = psbt_obj->psbt->GetTxInUtxo(index);
        psbt_obj->psbt->SetTxInUtxo(
            index, TxOutReference(txout), script, key_list);
      } break;
      case kCfdPsbtRecordTypeOutput:
        psbt_obj->psbt->SetTxOutData(index, script, key_list);
        break;
      default:
        warn(CFD_LOG_SOURCE, "type is invalid: {}", type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. type is invalid.");
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}